

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egl_context.c
# Opt level: O3

GLFWbool chooseEGLConfig(_GLFWctxconfig *ctxconfig,_GLFWfbconfig *desired,EGLConfig *result)

{
  EGLConfig pvVar1;
  ulong uVar2;
  int iVar3;
  GLFWbool GVar4;
  uint uVar5;
  EGLConfig *__ptr;
  undefined8 *puVar6;
  _GLFWfbconfig *p_Var7;
  size_t __nmemb;
  long lVar8;
  int nativeCount;
  int value_2;
  int value;
  int local_a8;
  int local_a4;
  EGLConfig *local_a0;
  _GLFWfbconfig *local_98;
  _GLFWctxconfig *local_90;
  ulong local_88;
  long lStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  EGLConfig *local_40;
  _GLFWfbconfig *local_38;
  
  uVar5 = 0;
  local_90 = ctxconfig;
  (*_glfw.egl.GetConfigs)(_glfw.egl.display,(EGLConfig *)0x0,0,&local_a8);
  iVar3 = local_a8;
  if ((long)local_a8 == 0) {
    uVar5 = 0;
    _glfwInputError(0x10006,"EGL: No EGLConfigs returned");
  }
  else {
    local_40 = result;
    __ptr = (EGLConfig *)calloc((long)local_a8,8);
    (*_glfw.egl.GetConfigs)(_glfw.egl.display,__ptr,iVar3,&local_a8);
    __nmemb = (size_t)local_a8;
    local_98 = (_GLFWfbconfig *)calloc(__nmemb,0x48);
    if (0 < (long)__nmemb) {
      lVar8 = 0;
      uVar5 = 0;
      local_a0 = __ptr;
      local_38 = desired;
      do {
        pvVar1 = __ptr[lVar8];
        (*_glfw.egl.GetConfigAttrib)(_glfw.egl.display,pvVar1,0x303f,(EGLint *)&local_88);
        if (((int)local_88 == 0x308e) &&
           ((*_glfw.egl.GetConfigAttrib)(_glfw.egl.display,pvVar1,0x3033,(EGLint *)&local_88),
           (local_88 & 4) != 0)) {
          local_58 = 0;
          uStack_50 = 0;
          local_68 = 0;
          uStack_60 = 0;
          local_78 = 0;
          uStack_70 = 0;
          local_88 = 0;
          lStack_80 = 0;
          (*_glfw.egl.GetConfigAttrib)(_glfw.egl.display,pvVar1,0x302e,&local_a4);
          lStack_80 = (long)local_a4;
          if (lStack_80 != 0) {
            p_Var7 = local_98 + (int)uVar5;
            if ((desired->transparent != 0) &&
               (puVar6 = (undefined8 *)XGetVisualInfo(_glfw.x11.display,1,&local_88,&local_a4),
               desired = local_38, puVar6 != (undefined8 *)0x0)) {
              GVar4 = _glfwIsVisualTransparentX11((Visual *)*puVar6);
              p_Var7->transparent = GVar4;
              XFree(puVar6);
              desired = local_38;
            }
            if (local_90->client == 0x30001) {
              (*_glfw.egl.GetConfigAttrib)(_glfw.egl.display,pvVar1,0x3040,(EGLint *)&local_88);
              uVar2 = local_88 & 8;
              __ptr = local_a0;
joined_r0x0012caf6:
              local_a0 = __ptr;
              if (uVar2 == 0) goto LAB_0012cc08;
            }
            else if (local_90->client == 0x30002) {
              if (local_90->major == 1) {
                (*_glfw.egl.GetConfigAttrib)(_glfw.egl.display,pvVar1,0x3040,(EGLint *)&local_88);
                uVar2 = local_88 & 1;
                __ptr = local_a0;
              }
              else {
                (*_glfw.egl.GetConfigAttrib)(_glfw.egl.display,pvVar1,0x3040,(EGLint *)&local_88);
                uVar2 = local_88 & 4;
                __ptr = local_a0;
              }
              goto joined_r0x0012caf6;
            }
            (*_glfw.egl.GetConfigAttrib)(_glfw.egl.display,pvVar1,0x3024,(EGLint *)&local_88);
            p_Var7->redBits = (int)local_88;
            (*_glfw.egl.GetConfigAttrib)(_glfw.egl.display,pvVar1,0x3023,(EGLint *)&local_88);
            p_Var7->greenBits = (int)local_88;
            (*_glfw.egl.GetConfigAttrib)(_glfw.egl.display,pvVar1,0x3022,(EGLint *)&local_88);
            p_Var7->blueBits = (int)local_88;
            (*_glfw.egl.GetConfigAttrib)(_glfw.egl.display,pvVar1,0x3021,(EGLint *)&local_88);
            p_Var7->alphaBits = (int)local_88;
            (*_glfw.egl.GetConfigAttrib)(_glfw.egl.display,pvVar1,0x3025,(EGLint *)&local_88);
            p_Var7->depthBits = (int)local_88;
            (*_glfw.egl.GetConfigAttrib)(_glfw.egl.display,pvVar1,0x3026,(EGLint *)&local_88);
            p_Var7->stencilBits = (int)local_88;
            (*_glfw.egl.GetConfigAttrib)(_glfw.egl.display,pvVar1,0x3031,(EGLint *)&local_88);
            p_Var7->samples = (int)local_88;
            p_Var7->doublebuffer = 1;
            p_Var7->handle = (uintptr_t)pvVar1;
            uVar5 = uVar5 + 1;
            __ptr = local_a0;
          }
        }
LAB_0012cc08:
        lVar8 = lVar8 + 1;
      } while (lVar8 < local_a8);
    }
    p_Var7 = _glfwChooseFBConfig(desired,local_98,uVar5);
    if (p_Var7 != (_GLFWfbconfig *)0x0) {
      *local_40 = (EGLConfig)p_Var7->handle;
    }
    uVar5 = (uint)(p_Var7 != (_GLFWfbconfig *)0x0);
    free(__ptr);
    free(local_98);
  }
  return uVar5;
}

Assistant:

static GLFWbool chooseEGLConfig(const _GLFWctxconfig* ctxconfig,
                                const _GLFWfbconfig* desired,
                                EGLConfig* result)
{
    EGLConfig* nativeConfigs;
    _GLFWfbconfig* usableConfigs;
    const _GLFWfbconfig* closest;
    int i, nativeCount, usableCount;

    eglGetConfigs(_glfw.egl.display, NULL, 0, &nativeCount);
    if (!nativeCount)
    {
        _glfwInputError(GLFW_API_UNAVAILABLE, "EGL: No EGLConfigs returned");
        return GLFW_FALSE;
    }

    nativeConfigs = calloc(nativeCount, sizeof(EGLConfig));
    eglGetConfigs(_glfw.egl.display, nativeConfigs, nativeCount, &nativeCount);

    usableConfigs = calloc(nativeCount, sizeof(_GLFWfbconfig));
    usableCount = 0;

    for (i = 0;  i < nativeCount;  i++)
    {
        const EGLConfig n = nativeConfigs[i];
        _GLFWfbconfig* u = usableConfigs + usableCount;

        // Only consider RGB(A) EGLConfigs
        if (getEGLConfigAttrib(n, EGL_COLOR_BUFFER_TYPE) != EGL_RGB_BUFFER)
            continue;

        // Only consider window EGLConfigs
        if (!(getEGLConfigAttrib(n, EGL_SURFACE_TYPE) & EGL_WINDOW_BIT))
            continue;

#if defined(_GLFW_X11)
        {
            XVisualInfo vi = {0};

            // Only consider EGLConfigs with associated Visuals
            vi.visualid = getEGLConfigAttrib(n, EGL_NATIVE_VISUAL_ID);
            if (!vi.visualid)
                continue;

            if (desired->transparent)
            {
                int count;
                XVisualInfo* vis =
                    XGetVisualInfo(_glfw.x11.display, VisualIDMask, &vi, &count);
                if (vis)
                {
                    u->transparent = _glfwIsVisualTransparentX11(vis[0].visual);
                    XFree(vis);
                }
            }
        }
#endif // _GLFW_X11

        if (ctxconfig->client == GLFW_OPENGL_ES_API)
        {
            if (ctxconfig->major == 1)
            {
                if (!(getEGLConfigAttrib(n, EGL_RENDERABLE_TYPE) & EGL_OPENGL_ES_BIT))
                    continue;
            }
            else
            {
                if (!(getEGLConfigAttrib(n, EGL_RENDERABLE_TYPE) & EGL_OPENGL_ES2_BIT))
                    continue;
            }
        }
        else if (ctxconfig->client == GLFW_OPENGL_API)
        {
            if (!(getEGLConfigAttrib(n, EGL_RENDERABLE_TYPE) & EGL_OPENGL_BIT))
                continue;
        }

        u->redBits = getEGLConfigAttrib(n, EGL_RED_SIZE);
        u->greenBits = getEGLConfigAttrib(n, EGL_GREEN_SIZE);
        u->blueBits = getEGLConfigAttrib(n, EGL_BLUE_SIZE);

        u->alphaBits = getEGLConfigAttrib(n, EGL_ALPHA_SIZE);
        u->depthBits = getEGLConfigAttrib(n, EGL_DEPTH_SIZE);
        u->stencilBits = getEGLConfigAttrib(n, EGL_STENCIL_SIZE);

        u->samples = getEGLConfigAttrib(n, EGL_SAMPLES);
        u->doublebuffer = GLFW_TRUE;

        u->handle = (uintptr_t) n;
        usableCount++;
    }

    closest = _glfwChooseFBConfig(desired, usableConfigs, usableCount);
    if (closest)
        *result = (EGLConfig) closest->handle;

    free(nativeConfigs);
    free(usableConfigs);

    return closest != NULL;
}